

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::SingleVertexArrayNormalizeTests::init
          (SingleVertexArrayNormalizeTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  GLValue max_;
  MultiVertexArrayTest *this_00;
  long lVar1;
  GLValue GVar2;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  int local_e4;
  undefined1 local_e0 [16];
  pointer local_d0;
  pointer pAStack_c8;
  pointer local_c0;
  long local_b8;
  string local_b0;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  ArraySpec local_70;
  
  local_b8 = 0;
  do {
    type = (&DAT_006573a0)[local_b8];
    local_e4 = 2;
    do {
      lVar1 = 0;
      do {
        GVar2 = deqp::gls::GLValue::getMinValue(type);
        aStack_78 = GVar2.field_1;
        local_80 = GVar2.type;
        GVar2 = deqp::gls::GLValue::getMaxValue(type);
        aStack_88 = GVar2.field_1;
        local_90 = GVar2.type;
        max_._4_4_ = uStack_8c;
        max_.type = local_90;
        GVar2._4_4_ = uStack_7c;
        GVar2.type = local_80;
        GVar2.field_1 = aStack_78;
        max_.field_1 = aStack_88;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  (&local_70,type,OUTPUTTYPE_VEC4,STORAGE_USER,USAGE_DYNAMIC_DRAW,local_e4,0,0,true,
                   GVar2,max_);
        local_d0 = (pointer)0x0;
        pAStack_c8 = (pointer)0x0;
        local_c0 = (pointer)0x0;
        local_e0._0_4_ = PRIMITIVE_TRIANGLES;
        local_e0._4_4_ = *(int *)((long)&DAT_00657368 + lVar1);
        local_e0._8_4_ = 0;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
        ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                  ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                    *)&local_d0,(iterator)0x0,&local_70);
        deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&local_b0,(Spec *)local_e0);
        this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
        deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                  (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   ((this->super_TestCaseGroup).m_context)->m_renderCtx,(Spec *)local_e0,
                   local_b0._M_dataplus._M_p,local_b0._M_dataplus._M_p);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_d0 != (pointer)0x0) {
          operator_delete(local_d0,(long)local_c0 - (long)local_d0);
        }
        lVar1 = lVar1 + 4;
      } while (lVar1 == 4);
      local_e4 = local_e4 + 1;
    } while (local_e4 != 5);
    local_b8 = local_b8 + 1;
  } while (local_b8 != 6);
  return 5;
}

Assistant:

void SingleVertexArrayNormalizeTests::init (void)
{
	// Test normalization with different input types, component counts and storage
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_UNSIGNED_SHORT, Array::INPUTTYPE_UNSIGNED_BYTE, Array::INPUTTYPE_FIXED};
	Array::Storage		storages[]		= {Array::STORAGE_USER};
	int					counts[]		= {1, 256};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
		{
			for (int componentCount = 2; componentCount < 5; componentCount++)
			{
				for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
				{
					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC4,
																	storages[storageNdx],
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	0,
																	0,
																	true,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();
					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}